

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

string * METADemuxer::mplsTrackToSSIFName
                   (string *__return_storage_ptr__,string *mplsFileName,string *mplsNum)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *__s;
  allocator<char> local_122;
  allocator<char> local_121;
  string ssifExt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string mplsExt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  extractFilePath(&mplsExt,mplsFileName);
  toNativeSeparators(&path,&mplsExt);
  std::__cxx11::string::~string((string *)&mplsExt);
  cVar1 = getDirSeparator();
  lVar3 = std::__cxx11::string::rfind((char)&path,(ulong)(uint)(int)cVar1);
  if (lVar3 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)&path);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"STREAM",&local_121);
    std::operator+(&local_a0,&local_c0,&local_60);
    cVar1 = getDirSeparator();
    std::operator+(&local_100,&local_a0,cVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SSIF",&local_122);
    std::operator+(&ssifExt,&local_100,&local_40);
    cVar1 = getDirSeparator();
    std::operator+(&mplsExt,&ssifExt,cVar1);
    std::__cxx11::string::operator=((string *)&path,(string *)&mplsExt);
    std::__cxx11::string::~string((string *)&mplsExt);
    std::__cxx11::string::~string((string *)&ssifExt);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_c0);
    extractFileExt(&ssifExt,mplsFileName);
    strToLowerCase(&mplsExt,&ssifExt);
    std::__cxx11::string::~string((string *)&ssifExt);
    bVar2 = std::operator==(&mplsExt,"mpls");
    __s = "sif";
    if (bVar2) {
      __s = "ssif";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ssifExt,__s,(allocator<char> *)&local_100);
    std::operator+(&local_a0,&path,mplsNum);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,".",(allocator<char> *)&local_60);
    std::operator+(&local_100,&local_a0,&local_c0);
    std::operator+(__return_storage_ptr__,&local_100,&ssifExt);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&ssifExt);
    std::__cxx11::string::~string((string *)&mplsExt);
  }
  std::__cxx11::string::~string((string *)&path);
  return __return_storage_ptr__;
}

Assistant:

std::string METADemuxer::mplsTrackToSSIFName(const std::string& mplsFileName, const std::string& mplsNum)
{
    string path = toNativeSeparators(extractFilePath(mplsFileName));
    const size_t tmp = path.find_last_of(getDirSeparator());
    if (tmp == string::npos)
        return {};
    path = path.substr(0, tmp + 1) + string("STREAM") + getDirSeparator() + string("SSIF") + getDirSeparator();

    const string mplsExt = strToLowerCase(extractFileExt(mplsFileName));
    const string ssifExt = mplsExt == "mpls" ? "ssif" : "sif";

    return path + mplsNum + string(".") + ssifExt;
}